

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression_binder.cpp
# Opt level: O2

bool duckdb::ExpressionBinder::ContainsType(LogicalType *type,LogicalTypeId target)

{
  bool bVar1;
  idx_t iVar2;
  LogicalType *pLVar3;
  idx_t i;
  idx_t iVar4;
  bool bVar5;
  
  do {
    bVar5 = type->id_ == target;
    if (bVar5) {
      return bVar5;
    }
    switch(type->id_) {
    case STRUCT:
      iVar2 = StructType::GetChildCount(type);
      iVar4 = 0;
      do {
        bVar5 = iVar2 != iVar4;
        if (iVar2 == iVar4) {
          return bVar5;
        }
        pLVar3 = StructType::GetChildType(type,iVar4);
        bVar1 = ContainsType(pLVar3,target);
        iVar4 = iVar4 + 1;
      } while (!bVar1);
      return bVar5;
    case LIST:
    case MAP:
      type = ListType::GetChildType(type);
      break;
    default:
      return bVar5;
    case UNION:
      iVar2 = UnionType::GetMemberCount(type);
      iVar4 = 0;
      do {
        bVar5 = iVar2 != iVar4;
        if (iVar2 == iVar4) {
          return bVar5;
        }
        pLVar3 = UnionType::GetMemberType(type,iVar4);
        bVar1 = ContainsType(pLVar3,target);
        iVar4 = iVar4 + 1;
      } while (!bVar1);
      return bVar5;
    case ARRAY:
      type = ArrayType::GetChildType(type);
    }
  } while( true );
}

Assistant:

bool ExpressionBinder::ContainsType(const LogicalType &type, LogicalTypeId target) {
	if (type.id() == target) {
		return true;
	}
	switch (type.id()) {
	case LogicalTypeId::STRUCT: {
		auto child_count = StructType::GetChildCount(type);
		for (idx_t i = 0; i < child_count; i++) {
			if (ContainsType(StructType::GetChildType(type, i), target)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::UNION: {
		auto member_count = UnionType::GetMemberCount(type);
		for (idx_t i = 0; i < member_count; i++) {
			if (ContainsType(UnionType::GetMemberType(type, i), target)) {
				return true;
			}
		}
		return false;
	}
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
		return ContainsType(ListType::GetChildType(type), target);
	case LogicalTypeId::ARRAY:
		return ContainsType(ArrayType::GetChildType(type), target);
	default:
		return false;
	}
}